

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,FunctionCall *f)

{
  Expression *e;
  CodePrinter *this_00;
  Function *f_00;
  string_view text;
  string_view text_00;
  string local_40;
  
  e = (f->super_Assignment).target.object;
  if (e != (Expression *)0x0) {
    printAssignmentSyntax(this,e);
  }
  this_00 = this->out;
  text._M_str = "call ";
  text._M_len = 5;
  choc::text::CodePrinter::writeBlock(this_00,text);
  f_00 = (f->function).object;
  if (f_00 != (Function *)0x0) {
    Program::ProgramImpl::getFunctionNameWithQualificationIfNeeded_abi_cxx11_
              (&local_40,(this->module->program).pimpl,this->module,f_00);
    text_00._M_str = local_40._M_dataplus._M_p;
    text_00._M_len = local_40._M_string_length;
    choc::text::CodePrinter::writeBlock(this_00,text_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p = (pointer)(f->arguments).items;
    local_40._M_string_length = (long)local_40._M_dataplus._M_p + (f->arguments).numActive * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

void printDescription (const heart::FunctionCall& f)
        {
            if (f.target != nullptr)
                printAssignmentSyntax (*f.target);

            out << "call " << getFunctionName (f.getFunction());
            printArgList (f.arguments);
        }